

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O0

void __thiscall
pele::physics::reactions::ReactorCvode::allocUserData
          (ReactorCvode *this,CVODEUserData *udata,int a_ncells)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  int iVar12;
  Arena *pAVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar14;
  void *pvVar15;
  realtype **pprVar16;
  sunindextype *psVar17;
  SUNMatrix p_Var18;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i_2;
  int i_1;
  int i;
  int nspec_tot;
  int HP;
  string prec_type_str;
  ParmParse ppcv;
  string solve_type_str;
  int *in_stack_00000c80;
  undefined4 in_stack_00000c88;
  int in_stack_00000c8c;
  undefined4 in_stack_00000c90;
  int in_stack_00000c94;
  int *in_stack_00000c98;
  int in_stack_00000ca0;
  int in_stack_00000ca4;
  int *in_stack_00000ca8;
  int *in_stack_00000cb0;
  int *in_stack_00000cb8;
  undefined4 in_stack_fffffffffffffbd8;
  sunindextype in_stack_fffffffffffffbdc;
  Print *in_stack_fffffffffffffbe0;
  SUNContext in_stack_fffffffffffffbe8;
  ParmParse *in_stack_fffffffffffffbf0;
  sunindextype *in_stack_fffffffffffffbf8;
  ostream *in_stack_fffffffffffffc08;
  Print *in_stack_fffffffffffffc10;
  Print *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  string *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  ParmParse *in_stack_fffffffffffffc70;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [143];
  allocator local_59;
  string local_58 [36];
  int local_34;
  long local_30;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  iVar12 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  local_34 = in_EDX;
  local_30 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"none",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"cvode",&local_e9);
  amrex::ParmParse::ParmParse(in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  *(undefined4 *)(local_30 + 0x10) = 2;
  amrex::ParmParse::query
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,(int *)in_stack_fffffffffffffc60,
             iVar12);
  amrex::ParmParse::query
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,iVar12);
  *(undefined4 *)(local_30 + 0x1c) = 0xffffffff;
  *(undefined4 *)(local_30 + 0x18) = 0;
  *(undefined4 *)(local_30 + 0x20) = 0xffffffff;
  bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffbe0,
                           (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  if (bVar11) {
    *(undefined4 *)(local_30 + 0x1c) = 0;
    *(undefined4 *)(local_30 + 0x18) = 0;
  }
  else {
    bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffbe0,
                             (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    if (bVar11) {
      *(undefined4 *)(local_30 + 0x1c) = 1;
    }
    else {
      bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffbe0,
                               (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
                              );
      if (bVar11) {
        *(undefined4 *)(local_30 + 0x1c) = 2;
        *(undefined4 *)(local_30 + 0x18) = 1;
      }
      else {
        bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffbe0,
                                 (char *)CONCAT44(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8));
        if (bVar11) {
          *(undefined4 *)(local_30 + 0x1c) = 3;
          *(undefined4 *)(local_30 + 0x18) = 1;
          local_8 = "solver_type sparse_direct requires the KLU library";
          amrex::Abort_host((char *)in_stack_fffffffffffffbf0);
        }
        else {
          bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffbe0,
                                   (char *)CONCAT44(in_stack_fffffffffffffbdc,
                                                    in_stack_fffffffffffffbd8));
          if (bVar11) {
            *(undefined4 *)(local_30 + 0x1c) = 4;
            *(undefined4 *)(local_30 + 0x18) = 1;
          }
          else {
            bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffbe0,
                                     (char *)CONCAT44(in_stack_fffffffffffffbdc,
                                                      in_stack_fffffffffffffbd8));
            if (bVar11) {
              *(undefined4 *)(local_30 + 0x1c) = 5;
            }
            else {
              bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffffbe0,
                                       (char *)CONCAT44(in_stack_fffffffffffffbdc,
                                                        in_stack_fffffffffffffbd8));
              if (bVar11) {
                *(undefined4 *)(local_30 + 0x1c) = 6;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_110,"sparse_simplified_AJacobian",&local_111);
                std::allocator<char>::~allocator((allocator<char> *)&local_111);
                amrex::ParmParse::query
                          (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                           in_stack_fffffffffffffc60,iVar12);
                bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffffbe0,
                                         (char *)CONCAT44(in_stack_fffffffffffffbdc,
                                                          in_stack_fffffffffffffbd8));
                if (bVar11) {
                  *(undefined4 *)(local_30 + 0x20) = 0;
                }
                else {
                  bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)in_stack_fffffffffffffbe0,
                                           (char *)CONCAT44(in_stack_fffffffffffffbdc,
                                                            in_stack_fffffffffffffbd8));
                  if (bVar11) {
                    *(undefined4 *)(local_30 + 0x20) = 1;
                    local_10 = "precond_type sparse_simplified_AJacobian requires the KLU library";
                    amrex::Abort_host((char *)in_stack_fffffffffffffbf0);
                  }
                  else {
                    bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffffbe0,
                                             (char *)CONCAT44(in_stack_fffffffffffffbdc,
                                                              in_stack_fffffffffffffbd8));
                    if (bVar11) {
                      *(undefined4 *)(local_30 + 0x20) = 2;
                    }
                    else {
                      local_18 = 
                      "Wrong precond_type. Options are: \'dense_simplified_AJacobian\', \'sparse_simplified_AJacobian\', \'custom_simplified_AJacobian\'"
                      ;
                      amrex::Abort_host((char *)in_stack_fffffffffffffbf0);
                    }
                  }
                }
                amrex::OutStream();
                amrex::Print::Print(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
                amrex::Print::operator<<
                          (in_stack_fffffffffffffbe0,
                           (char (*) [2])
                           CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                amrex::Print::~Print(in_stack_fffffffffffffc50);
                std::__cxx11::string::~string(local_110);
              }
              else {
                local_20 = 
                "Wrong solve_type. Options are: \'dense_direct\', denseAJ_direct\', \'sparse_direct\', \'custom_direct\', \'GMRES\', \'precGMRES\', \'fixed_point\'"
                ;
                amrex::Abort_host((char *)in_stack_fffffffffffffbf0);
              }
            }
          }
        }
      }
    }
  }
  iVar12 = local_34 * 0x15;
  *(undefined4 *)(local_30 + 0x14) = *(undefined4 *)(in_RDI + 0xd4);
  *(int *)(local_30 + 8) = local_34;
  *(undefined4 *)(local_30 + 0xc) = *(undefined4 *)(in_RDI + 8);
  pAVar13 = amrex::The_Arena();
  iVar12 = (*pAVar13->_vptr_Arena[2])(pAVar13,(long)iVar12 << 3);
  *(ulong *)(local_30 + 0x38) = CONCAT44(extraout_var,iVar12);
  pAVar13 = amrex::The_Arena();
  iVar12 = (*pAVar13->_vptr_Arena[2])(pAVar13,(long)local_34 << 3);
  *(ulong *)(local_30 + 0x28) = CONCAT44(extraout_var_00,iVar12);
  pAVar13 = amrex::The_Arena();
  iVar12 = (*pAVar13->_vptr_Arena[2])(pAVar13,(long)local_34 << 3);
  *(ulong *)(local_30 + 0x30) = CONCAT44(extraout_var_01,iVar12);
  pAVar13 = amrex::The_Arena();
  iVar12 = (*pAVar13->_vptr_Arena[2])(pAVar13,(long)local_34 << 2);
  *(ulong *)(local_30 + 0x40) = CONCAT44(extraout_var_02,iVar12);
  pAVar13 = amrex::The_Arena();
  iVar12 = (*pAVar13->_vptr_Arena[2])(pAVar13,(long)local_34 << 2);
  *(ulong *)(local_30 + 0x48) = CONCAT44(extraout_var_03,iVar12);
  *(undefined1 *)(local_30 + 0x60) = 1;
  if ((*(int *)(local_30 + 0x1c) != 3) && (*(int *)(local_30 + 0x1c) == 4)) {
    SPARSITY_INFO_SYST(in_stack_00000c98,(int *)CONCAT44(in_stack_00000c94,in_stack_00000c90),
                       in_stack_00000c8c);
    amrex::OpenMP::get_thread_num();
    amrex::sundials::The_Sundials_Context(0);
    sundials::Context::operator_cast_to__SUNContext_((Context *)0x3138cb);
    p_Var18 = SUNSparseMatrix((sunindextype)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                              (sunindextype)in_stack_fffffffffffffbf8,
                              (sunindextype)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                              (int)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    *(SUNMatrix *)(local_30 + 0xc0) = p_Var18;
    psVar17 = SUNSparseMatrix_IndexPointers
                        ((SUNMatrix)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    *(sunindextype **)(local_30 + 0xd0) = psVar17;
    psVar17 = SUNSparseMatrix_IndexValues
                        ((SUNMatrix)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    *(sunindextype **)(local_30 + 200) = psVar17;
    SPARSITY_PREPROC_SYST_CSR
              (in_stack_00000cb8,in_stack_00000cb0,in_stack_00000ca8,in_stack_00000ca4,
               in_stack_00000ca0);
  }
  if (*(int *)(local_30 + 0x20) == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*(int *)(local_30 + 8);
    uVar14 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar14);
    *(void **)(local_30 + 0xb0) = pvVar15;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)*(int *)(local_30 + 8);
    uVar14 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar14);
    *(void **)(local_30 + 0xa8) = pvVar15;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)*(int *)(local_30 + 8);
    uVar14 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar14);
    *(void **)(local_30 + 0xb8) = pvVar15;
    for (local_2ac = 0; local_2ac < *(int *)(local_30 + 8); local_2ac = local_2ac + 1) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)*(int *)(local_30 + 8);
      uVar14 = SUB168(auVar4 * ZEXT816(8),0);
      if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pvVar15 = operator_new__(uVar14);
      *(void **)(*(long *)(local_30 + 0xb0) + (long)local_2ac * 8) = pvVar15;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (long)*(int *)(local_30 + 8);
      uVar14 = SUB168(auVar5 * ZEXT816(8),0);
      if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pvVar15 = operator_new__(uVar14);
      *(void **)(*(long *)(local_30 + 0xa8) + (long)local_2ac * 8) = pvVar15;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (long)*(int *)(local_30 + 8);
      uVar14 = SUB168(auVar6 * ZEXT816(8),0);
      if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pvVar15 = operator_new__(uVar14);
      *(void **)(*(long *)(local_30 + 0xb8) + (long)local_2ac * 8) = pvVar15;
    }
    for (local_2b0 = 0; local_2b0 < *(int *)(local_30 + 8); local_2b0 = local_2b0 + 1) {
      pprVar16 = SUNDlsMat_newDenseMat
                           ((sunindextype)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                            (sunindextype)in_stack_fffffffffffffbe8);
      *(realtype ***)
       (*(long *)(*(long *)(local_30 + 0xb0) + (long)local_2b0 * 8) + (long)local_2b0 * 8) =
           pprVar16;
      pprVar16 = SUNDlsMat_newDenseMat
                           ((sunindextype)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                            (sunindextype)in_stack_fffffffffffffbe8);
      *(realtype ***)
       (*(long *)(*(long *)(local_30 + 0xa8) + (long)local_2b0 * 8) + (long)local_2b0 * 8) =
           pprVar16;
      psVar17 = SUNDlsMat_newIndexArray(in_stack_fffffffffffffbdc);
      *(sunindextype **)
       (*(long *)(*(long *)(local_30 + 0xb8) + (long)local_2b0 * 8) + (long)local_2b0 * 8) = psVar17
      ;
    }
  }
  else if ((*(int *)(local_30 + 0x20) != 1) && (*(int *)(local_30 + 0x20) == 2)) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)*(int *)(local_30 + 8);
    uVar14 = SUB168(auVar7 * ZEXT816(8),0);
    if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar14);
    *(void **)(local_30 + 0x90) = pvVar15;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)*(int *)(local_30 + 8);
    uVar14 = SUB168(auVar8 * ZEXT816(8),0);
    if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar14);
    *(void **)(local_30 + 0x80) = pvVar15;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (long)*(int *)(local_30 + 8);
    uVar14 = SUB168(auVar9 * ZEXT816(8),0);
    if (SUB168(auVar9 * ZEXT816(8),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar14);
    *(void **)(local_30 + 0x70) = pvVar15;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)*(int *)(local_30 + 8);
    uVar14 = SUB168(auVar10 * ZEXT816(8),0);
    if (SUB168(auVar10 * ZEXT816(8),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar14);
    *(void **)(local_30 + 0xa0) = pvVar15;
    SPARSITY_INFO_SYST_SIMPLIFIED
              ((int *)CONCAT44(in_stack_00000c8c,in_stack_00000c88),in_stack_00000c80);
    for (local_2b4 = 0; local_2b4 < *(int *)(local_30 + 8); local_2b4 = local_2b4 + 1) {
      amrex::OpenMP::get_thread_num();
      amrex::sundials::The_Sundials_Context(0);
      sundials::Context::operator_cast_to__SUNContext_((Context *)0x313e5a);
      p_Var18 = SUNSparseMatrix((sunindextype)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                                (sunindextype)in_stack_fffffffffffffbf8,
                                (sunindextype)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                                (int)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      *(SUNMatrix *)(*(long *)(local_30 + 0x70) + (long)local_2b4 * 8) = p_Var18;
      in_stack_fffffffffffffbf8 =
           SUNSparseMatrix_IndexPointers
                     ((SUNMatrix)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      *(sunindextype **)(*(long *)(local_30 + 0x80) + (long)local_2b4 * 8) =
           in_stack_fffffffffffffbf8;
      in_stack_fffffffffffffbf0 =
           (ParmParse *)
           SUNSparseMatrix_IndexValues
                     ((SUNMatrix)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      *(ParmParse **)(*(long *)(local_30 + 0x90) + (long)local_2b4 * 8) = in_stack_fffffffffffffbf0;
      in_stack_fffffffffffffbe8 =
           (SUNContext)
           SUNSparseMatrix_Data
                     ((SUNMatrix)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      *(SUNContext *)(*(long *)(local_30 + 0x68) + (long)local_2b4 * 8) = in_stack_fffffffffffffbe8;
      SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR
                (in_stack_00000ca8,(int *)CONCAT44(in_stack_00000ca4,in_stack_00000ca0),
                 in_stack_00000c98,in_stack_00000c94);
      pvVar15 = operator_new__(0xf20);
      *(void **)(*(long *)(local_30 + 0xa0) + (long)local_2b4 * 8) = pvVar15;
    }
  }
  amrex::ParmParse::~ParmParse((ParmParse *)0x313ff9);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void
ReactorCvode::allocUserData(
  CVODEUserData* udata,
  int a_ncells
#ifdef AMREX_USE_GPU
  ,
  SUNMatrix& a_A,
  amrex::gpuStream_t stream
#endif
) const
{
  // Query options
  std::string solve_type_str = "none";
  amrex::ParmParse ppcv("cvode");
  udata->maxOrder = 2;
  ppcv.query("max_order", udata->maxOrder);
  ppcv.query("solve_type", solve_type_str);
  // Defaults
  udata->solve_type = -1;
  udata->analytical_jacobian = 0;
  udata->precond_type = -1;

#ifdef AMREX_USE_GPU
  if (solve_type_str == "fixed_point") {
    udata->solve_type = cvode::fixedPoint;
    udata->analytical_jacobian = 0;
  } else if (solve_type_str == "sparse_direct") {
    udata->solve_type = cvode::sparseDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "custom_direct") {
    udata->solve_type = cvode::customDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "magma_direct") {
    udata->solve_type = cvode::magmaDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "GMRES") {
    udata->solve_type = cvode::GMRES;
  } else if (solve_type_str == "precGMRES") {
    udata->solve_type = cvode::precGMRES;
    std::string prec_type_str = "cuSparse_simplified_AJacobian";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "cuSparse_simplified_AJacobian") {
      udata->precond_type = cvode::sparseSimpleAJac;
    } else {
      amrex::Abort(
        "Wrong precond_type. Only option is: 'cuSparse_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'sparse_direct', 'custom_direct', "
      "'GMRES', 'precGMRES', 'fixed_point'");
  }

#else
  if (solve_type_str == "fixed_point") {
    udata->solve_type = cvode::fixedPoint;
    udata->analytical_jacobian = 0;
  } else if (solve_type_str == "dense_direct") {
    udata->solve_type = cvode::denseFDDirect;
  } else if (solve_type_str == "denseAJ_direct") {
    udata->solve_type = cvode::denseDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "sparse_direct") {
    udata->solve_type = cvode::sparseDirect;
    udata->analytical_jacobian = 1;
#ifndef PELE_USE_KLU
    amrex::Abort("solver_type sparse_direct requires the KLU library");
#endif
  } else if (solve_type_str == "custom_direct") {
    udata->solve_type = cvode::customDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "GMRES") {
    udata->solve_type = cvode::GMRES;
  } else if (solve_type_str == "precGMRES") {
    udata->solve_type = cvode::precGMRES;
    std::string prec_type_str = "sparse_simplified_AJacobian";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "dense_simplified_AJacobian") {
      udata->precond_type = cvode::denseSimpleAJac;
    } else if (prec_type_str == "sparse_simplified_AJacobian") {
      udata->precond_type = cvode::sparseSimpleAJac;
#ifndef PELE_USE_KLU
      amrex::Abort(
        "precond_type sparse_simplified_AJacobian requires the KLU library");
#endif
    } else if (prec_type_str == "custom_simplified_AJacobian") {
      udata->precond_type = cvode::customSimpleAJac;
    } else {
      amrex::Abort(
        "Wrong precond_type. Options are: 'dense_simplified_AJacobian', "
        "'sparse_simplified_AJacobian', 'custom_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'dense_direct', denseAJ_direct', "
      "'sparse_direct', 'custom_direct', 'GMRES', 'precGMRES', 'fixed_point'");
  }
#endif

  // Pass options to udata
  const int HP =
    static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
  int nspec_tot = (NUM_SPECIES)*a_ncells;
  udata->reactor_type = m_reactor_type;
  udata->ncells = a_ncells;
  udata->verbose = verbose;
#ifdef AMREX_USE_GPU
  udata->nbThreads = 32;
  udata->nbBlocks = std::max(1, a_ncells / udata->nbThreads);
  udata->stream = stream;
#endif

  // Alloc internal udata solution/forcing containers
  udata->rYsrc_ext = static_cast<amrex::Real*>(
    amrex::The_Arena()->alloc(nspec_tot * sizeof(amrex::Real)));
  udata->rhoe_init = static_cast<amrex::Real*>(
    amrex::The_Arena()->alloc(a_ncells * sizeof(amrex::Real)));
  udata->rhoesrc_ext = static_cast<amrex::Real*>(
    amrex::The_Arena()->alloc(a_ncells * sizeof(amrex::Real)));
  udata->mask =
    static_cast<int*>(amrex::The_Arena()->alloc(a_ncells * sizeof(int)));

#ifndef AMREX_USE_GPU
  udata->FCunt =
    static_cast<int*>(amrex::The_Arena()->alloc(a_ncells * sizeof(int)));
  udata->FirstTimePrecond = true;
#endif

  // Alloc internal udata Analytical Jacobian containers
#ifdef AMREX_USE_GPU
  if (udata->solve_type == cvode::sparseDirect) {
#ifdef AMREX_USE_CUDA
    SPARSITY_INFO_SYST(&(udata->NNZ), &HP, 1);
    udata->csr_row_count_h = static_cast<int*>(
      amrex::The_Pinned_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int)));
    udata->csr_col_index_h = static_cast<int*>(
      amrex::The_Pinned_Arena()->alloc(udata->NNZ * sizeof(int)));

    cusolverStatus_t cusolver_status = CUSOLVER_STATUS_SUCCESS;
    cusolver_status = cusolverSpCreate(&(udata->cusolverHandle));
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    cusolver_status = cusolverSpSetStream(udata->cusolverHandle, stream);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    cusparseStatus_t cusparse_status = CUSPARSE_STATUS_SUCCESS;
    cusparse_status = cusparseCreate(&(udata->cuSPHandle));
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status = cusparseSetStream(udata->cuSPHandle, stream);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);

    a_A = SUNMatrix_cuSparse_NewBlockCSR(
      a_ncells, (NUM_SPECIES + 1), (NUM_SPECIES + 1), udata->NNZ,
      udata->cuSPHandle, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag((void*)a_A, "SUNMatrix_cuSparse_NewBlockCSR", 0)) {
      amrex::Abort("Something went wrong while creating cuSparse_NewBlockCSR");
    }

    int retval = SUNMatrix_cuSparse_SetFixedPattern(a_A, 1);

    SPARSITY_PREPROC_SYST_CSR(
      udata->csr_col_index_h, udata->csr_row_count_h, &HP, 1, 0);
    int sunMatFlag = SUNMatrix_cuSparse_CopyToDevice(
      a_A, nullptr, udata->csr_row_count_h, udata->csr_col_index_h);
    if (sunMatFlag != SUNMAT_SUCCESS) {
      amrex::Print()
        << " Something went wrong in SUNMatrix_cuSparse_CopyToDevice \n";
    }
#else
    amrex::Abort(
      "Solver_type sparse_direct is only available with CUDA on GPU");
#endif
  } else if (udata->solve_type == cvode::customDirect) {
#ifdef AMREX_USE_CUDA
    SPARSITY_INFO_SYST(&(udata->NNZ), &HP, 1);
    udata->csr_row_count_h =
      (int*)amrex::The_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int));
    udata->csr_col_index_h =
      (int*)amrex::The_Arena()->alloc(udata->NNZ * sizeof(int));

    cusparseStatus_t cusparse_status = CUSPARSE_STATUS_SUCCESS;
    cusparse_status = cusparseCreate(&(udata->cuSPHandle));
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status = cusparseSetStream(udata->cuSPHandle, stream);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);

    a_A = SUNMatrix_cuSparse_NewBlockCSR(
      a_ncells, (NUM_SPECIES + 1), (NUM_SPECIES + 1), udata->NNZ,
      udata->cuSPHandle, *amrex::sundials::The_Sundials_Context());
    // if (utils::check_flag((void *)a_A, "SUNMatrix_cuSparse_NewBlockCSR", 0))
    // return(1);

    int retval = SUNMatrix_cuSparse_SetFixedPattern(a_A, 1);
    // if(utils::check_flag(&retval, "SUNMatrix_cuSparse_SetFixedPattern", 1))
    // return(1);

    SPARSITY_PREPROC_SYST_CSR(
      udata->csr_col_index_h, udata->csr_row_count_h, &HP, 1, 0);
#else
    amrex::Abort(
      "Solver_type custom_direct is only available with CUDA on GPU");
#endif
  } else if (udata->solve_type == cvode::magmaDirect) {
#ifdef PELE_USE_MAGMA
    a_A = SUNMatrix_MagmaDenseBlock(
      a_ncells, (NUM_SPECIES + 1), (NUM_SPECIES + 1), SUNMEMTYPE_DEVICE,
      *amrex::sundials::The_SUNMemory_Helper(), nullptr,
      *amrex::sundials::The_Sundials_Context());
#else
    amrex::Abort("Solver_type magma_direct reauires PELE_USE_MAGMA = TRUE");
#endif
  }

#else
  if (udata->solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
    // CSC matrices data -> one big matrix used for the direct solve
    udata->colPtrs = new int*[1];
    udata->rowVals = new int*[1];
    udata->Jdata = new amrex::Real*[1];

    // Number of non zero elements in ODE system
    SPARSITY_INFO(&(udata->NNZ), &HP, udata->ncells);
    // Build Sparse Matrix for direct sparse KLU solver
    (udata->PS) = new SUNMatrix[1];
    (udata->PS)[0] = SUNSparseMatrix(
      (NUM_SPECIES + 1) * udata->ncells, (NUM_SPECIES + 1) * udata->ncells,
      udata->NNZ * udata->ncells, CSC_MAT,
      *amrex::sundials::The_Sundials_Context());
    udata->colPtrs[0] =
      static_cast<int*>(SUNSparseMatrix_IndexPointers((udata->PS)[0]));
    udata->rowVals[0] =
      static_cast<int*>(SUNSparseMatrix_IndexValues((udata->PS)[0]));
    udata->Jdata[0] = SUNSparseMatrix_Data((udata->PS)[0]);
    SPARSITY_PREPROC_CSC(
      udata->rowVals[0], udata->colPtrs[0], &HP, udata->ncells);
#endif
  } else if (udata->solve_type == cvode::customDirect) {
    // Number of non zero elements in ODE system
    SPARSITY_INFO_SYST(&(udata->NNZ), &HP, udata->ncells);
    // Build the SUNmatrix as CSR sparse and fill ptrs to row/Vals
    udata->PSc = SUNSparseMatrix(
      (NUM_SPECIES + 1) * udata->ncells, (NUM_SPECIES + 1) * udata->ncells,
      udata->NNZ * udata->ncells, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    udata->rowPtrs_c =
      static_cast<int*>(SUNSparseMatrix_IndexPointers(udata->PSc));
    udata->colVals_c =
      static_cast<int*>(SUNSparseMatrix_IndexValues(udata->PSc));
    SPARSITY_PREPROC_SYST_CSR(
      udata->colVals_c, udata->rowPtrs_c, &HP, udata->ncells, 0);
  }
#endif

  // Alloc internal udata Preconditioner containers
#ifdef AMREX_USE_GPU
  if (udata->precond_type == cvode::sparseSimpleAJac) {
#ifdef AMREX_USE_CUDA
    SPARSITY_INFO_SYST_SIMPLIFIED(&(udata->NNZ), &HP);
    udata->csr_row_count_h =
      (int*)amrex::The_Pinned_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int));
    udata->csr_col_index_h =
      (int*)amrex::The_Pinned_Arena()->alloc(udata->NNZ * sizeof(int));

    udata->csr_row_count_d =
      (int*)amrex::The_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int));
    udata->csr_col_index_d =
      (int*)amrex::The_Arena()->alloc(udata->NNZ * sizeof(int));
    udata->csr_jac_d = (amrex::Real*)amrex::The_Arena()->alloc(
      udata->NNZ * a_ncells * sizeof(amrex::Real));
    udata->csr_val_d = (amrex::Real*)amrex::The_Arena()->alloc(
      udata->NNZ * a_ncells * sizeof(amrex::Real));

    SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(
      udata->csr_col_index_h, udata->csr_row_count_h, &HP, 1);

    amrex::Gpu::htod_memcpy(
      &udata->csr_col_index_d, &udata->csr_col_index_h,
      sizeof(udata->NNZ * sizeof(int)));
    amrex::Gpu::htod_memcpy(
      &udata->csr_row_count_d, &udata->csr_row_count_h,
      sizeof((NUM_SPECIES + 2) * sizeof(int)));

    size_t workspaceInBytes = 0;
    size_t internalDataInBytes = 0;

    cusolverStatus_t cusolver_status = CUSOLVER_STATUS_SUCCESS;
    cusolver_status = cusolverSpCreate(&(udata->cusolverHandle));
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    cusolver_status = cusolverSpSetStream(udata->cusolverHandle, stream);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    cusparseStatus_t cusparse_status = CUSPARSE_STATUS_SUCCESS;
    cusparse_status = cusparseCreateMatDescr(&(udata->descrA));
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status =
      cusparseSetMatType(udata->descrA, CUSPARSE_MATRIX_TYPE_GENERAL);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status =
      cusparseSetMatIndexBase(udata->descrA, CUSPARSE_INDEX_BASE_ONE);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusolver_status = cusolverSpCreateCsrqrInfo(&(udata->info));
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    // symbolic analysis
    cusolver_status = cusolverSpXcsrqrAnalysisBatched(
      udata->cusolverHandle,
      NUM_SPECIES + 1, // size per subsystem
      NUM_SPECIES + 1, // size per subsystem
      udata->NNZ, udata->descrA, udata->csr_row_count_h, udata->csr_col_index_h,
      udata->info);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    /*
    size_t free_mem = 0;
    size_t total_mem = 0;
    cudaStat1 = cudaMemGetInfo( &free_mem, &total_mem );
    AMREX_ASSERT( cudaSuccess == cudaStat1 );
    std::cout<<"(AFTER SA) Free: "<< free_mem<< " Tot: "<<total_mem<<std::endl;
    */

    // allocate working space
    cusolver_status = cusolverSpDcsrqrBufferInfoBatched(
      udata->cusolverHandle,
      NUM_SPECIES + 1, // size per subsystem
      NUM_SPECIES + 1, // size per subsystem
      udata->NNZ, udata->descrA, udata->csr_val_d, udata->csr_row_count_h,
      udata->csr_col_index_h, a_ncells, udata->info, &internalDataInBytes,
      &workspaceInBytes);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    // amrex::Print() << " BufferInfo workspaceInBytes " << workspaceInBytes <<
    // "\n";

    cudaError_t cudaStat1 = cudaSuccess;
    cudaStat1 = cudaMalloc((void**)&(udata->buffer_qr), workspaceInBytes);
    AMREX_ASSERT(cudaStat1 == cudaSuccess);
#else
    amrex::Abort(
      "cuSparse_simplified_AJacobian is only available with CUDA on GPU");
#endif
  }

#else
  if (udata->precond_type == cvode::denseSimpleAJac) {
    // Matrix data : big bunch of dimensions, not sure why. Generally ncells ==
    // 1 so not too bad Simply create the space.
    (udata->P) = new amrex::Real***[udata->ncells];
    (udata->Jbd) = new amrex::Real***[udata->ncells];
    (udata->pivot) = new sunindextype**[udata->ncells];
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->P)[i] = new amrex::Real**[udata->ncells];
      (udata->Jbd)[i] = new amrex::Real**[udata->ncells];
      (udata->pivot)[i] = new sunindextype*[udata->ncells];
    }
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->P)[i][i] =
        SUNDlsMat_newDenseMat(NUM_SPECIES + 1, NUM_SPECIES + 1);
      (udata->Jbd)[i][i] =
        SUNDlsMat_newDenseMat(NUM_SPECIES + 1, NUM_SPECIES + 1);
      (udata->pivot)[i][i] = SUNDlsMat_newIndexArray(NUM_SPECIES + 1);
    }
  } else if (udata->precond_type == cvode::sparseSimpleAJac) {
#ifdef PELE_USE_KLU
    // CSC matrices data for each submatrix (cells)
    udata->colPtrs = new int*[udata->ncells];
    udata->rowVals = new int*[udata->ncells];
    udata->Jdata = new amrex::Real*[udata->ncells];

    // KLU internal storage
    udata->Common = new klu_common[udata->ncells];
    udata->Symbolic = new klu_symbolic*[udata->ncells];
    udata->Numeric = new klu_numeric*[udata->ncells];
    // Sparse Matrices for It Sparse KLU block-solve
    udata->PS = new SUNMatrix[udata->ncells];
    // Number of non zero elements
    SPARSITY_INFO_SYST_SIMPLIFIED(&(udata->NNZ), &HP);
    // Not used yet. TODO use to fetch sparse Mat
    udata->indx = new int[udata->NNZ];
    udata->JSPSmat = new amrex::Real*[udata->ncells];
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->PS)[i] = SUNSparseMatrix(
        NUM_SPECIES + 1, NUM_SPECIES + 1, udata->NNZ, CSC_MAT,
        *amrex::sundials::The_Sundials_Context());
      udata->colPtrs[i] = (int*)SUNSparseMatrix_IndexPointers((udata->PS)[i]);
      udata->rowVals[i] = (int*)SUNSparseMatrix_IndexValues((udata->PS)[i]);
      udata->Jdata[i] = SUNSparseMatrix_Data((udata->PS)[i]);
      // indx not used YET
      SPARSITY_PREPROC_SYST_SIMPLIFIED_CSC(
        udata->rowVals[i], udata->colPtrs[i], udata->indx, &HP);
      udata->JSPSmat[i] =
        new amrex::Real[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)];
      klu_defaults(&(udata->Common[i]));
      // udata->Common.btf = 0;
      //(udata->Common[i]).maxwork = 15;
      // udata->Common.ordering = 1;
      udata->Symbolic[i] = klu_analyze(
        NUM_SPECIES + 1, udata->colPtrs[i], udata->rowVals[i],
        &(udata->Common[i]));
    }
#endif
  } else if (udata->precond_type == cvode::customSimpleAJac) {
    // CSR matrices data for each submatrix (cells)
    udata->colVals = new int*[udata->ncells];
    udata->rowPtrs = new int*[udata->ncells];
    // Matrices for each sparse custom block-solve
    udata->PS = new SUNMatrix[udata->ncells];
    udata->JSPSmat = new amrex::Real*[udata->ncells];
    // Number of non zero elements
    SPARSITY_INFO_SYST_SIMPLIFIED(&(udata->NNZ), &HP);
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->PS)[i] = SUNSparseMatrix(
        NUM_SPECIES + 1, NUM_SPECIES + 1, udata->NNZ, CSR_MAT,
        *amrex::sundials::The_Sundials_Context());
      udata->rowPtrs[i] =
        static_cast<int*>(SUNSparseMatrix_IndexPointers((udata->PS)[i]));
      udata->colVals[i] =
        static_cast<int*>(SUNSparseMatrix_IndexValues((udata->PS)[i]));
      udata->Jdata[i] = SUNSparseMatrix_Data((udata->PS)[i]);
      SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(
        udata->colVals[i], udata->rowPtrs[i], &HP, 0);
      udata->JSPSmat[i] =
        new amrex::Real[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)];
    }
  }
#endif
}